

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::mac_project
          (NavierStokesBase *this,Real time,Real dt,MultiFab *S_old,MultiFab *divu,int ngrow,
          bool increment_vel_register)

{
  ostringstream *this_00;
  char local_1e9;
  Real local_1e8;
  double local_1e0;
  Real local_1d8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> density_math_bc;
  Print local_1b8;
  
  local_1e8 = time;
  local_1d8 = dt;
  if (verbose != 0) {
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"... mac_projection\n",0x13);
    amrex::Print::~Print(&local_1b8);
  }
  if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  local_1e0 = amrex::ParallelDescriptor::second();
  fetchBCArray(&density_math_bc,this,0,3,1);
  MacProj::mac_project
            (mac_projector,(this->super_AmrLevel).level,this->u_mac,S_old,local_1d8,local_1e8,divu,
             have_divu,
             density_math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start,increment_vel_register);
  create_umac_grown(this,ngrow,divu);
  if (verbose != 0) {
    local_1e8 = amrex::ParallelDescriptor::second();
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    this_00 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"NavierStokesBase:mac_project(): lev: ",0x25);
    std::ostream::operator<<(this_00,(this->super_AmrLevel).level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", time: ",8);
    std::ostream::_M_insert<double>(local_1e8 - local_1e0);
    local_1e9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1e9,1);
    amrex::Print::~Print(&local_1b8);
  }
  if (density_math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(density_math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)density_math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)density_math_bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
NavierStokesBase::mac_project (Real      time,
                               Real      dt,
                               MultiFab& S_old,
                               MultiFab* divu,
                               int       ngrow,
                               bool      increment_vel_register)
{
    BL_PROFILE_REGION_START("R::NavierStokesBase::mac_project()");
    BL_PROFILE("NavierStokesBase::mac_project()");

    if (verbose) {
        amrex::Print() << "... mac_projection\n";
    }

    if (verbose && benchmarking) {
        ParallelDescriptor::Barrier();
    }

    const Real strt_time = ParallelDescriptor::second();

    Vector<BCRec> density_math_bc = fetchBCArray(State_Type,Density,1);

    mac_projector->mac_project(level,u_mac,S_old,dt,time,*divu,have_divu,
                               density_math_bc[0], increment_vel_register);

    create_umac_grown(ngrow, divu);

    if (verbose)
    {
        Real run_time    = ParallelDescriptor::second() - strt_time;
        const int IOProc = ParallelDescriptor::IOProcessorNumber();

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "NavierStokesBase:mac_project(): lev: "
                       << level
                       << ", time: " << run_time << '\n';
    }
    BL_PROFILE_REGION_STOP("R::NavierStokesBase::mac_project()");
}